

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegularExpression.cpp
# Opt level: O3

bool __thiscall
Js::JavascriptRegExp::GetPropertyBuiltIns
          (JavascriptRegExp *this,PropertyId propertyId,Var *value,BOOL *result)

{
  JavascriptLibrary *this_00;
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  JavascriptString *pJVar5;
  undefined4 *puVar6;
  uint64 uVar7;
  uint64 uVar8;
  void *pvVar9;
  Type *addr;
  double value_00;
  
  this_00 = (((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr;
  pSVar1 = (this_00->super_JavascriptLibraryBase).scriptContext.ptr;
  bVar3 = false;
  switch(propertyId) {
  case 0x1a0:
    if (((pSVar1->config).threadConfig)->m_ES6RegExPrototypeProperties != false) {
      return false;
    }
    bVar3 = UnifiedRegex::RegexPattern::IsGlobal((this->pattern).ptr);
    break;
  case 0x1a1:
    goto switchD_00d07ece_caseD_1a1;
  case 0x1a2:
    pJVar5 = (JavascriptString *)(this->lastIndexVar).ptr;
    if (pJVar5 == (JavascriptString *)0x0) {
      uVar4 = this->lastIndexOrFlag;
      if (uVar4 < 0x7fffffff) {
LAB_00d07fdd:
        pvVar9 = (void *)((ulong)uVar4 | 0x1000000000000);
      }
      else {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptRegularExpression.cpp"
                                    ,0x4ae,"(lastIndexOrFlag <= MaxCharCount)",
                                    "lastIndexOrFlag <= MaxCharCount");
        if (!bVar3) {
LAB_00d08136:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar6 = 0;
        uVar4 = this->lastIndexOrFlag;
        if (-1 < (int)uVar4) goto LAB_00d07fdd;
        value_00 = (double)uVar4;
        uVar7 = NumberUtilities::ToSpecial(value_00);
        bVar3 = NumberUtilities::IsNan(value_00);
        if (((bVar3) && (uVar8 = NumberUtilities::ToSpecial(value_00), uVar8 != 0xfff8000000000000))
           && (uVar8 = NumberUtilities::ToSpecial(value_00), uVar8 != 0x7ff8000000000000)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar6 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                      ,0xa2,
                                      "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                      ,"We should only produce a NaN with this value");
          if (!bVar3) goto LAB_00d08136;
          *puVar6 = 0;
        }
        pvVar9 = (void *)(uVar7 ^ 0xfffc000000000000);
      }
      addr = &this->lastIndexVar;
      Memory::Recycler::WBSetBit((char *)addr);
      addr->ptr = pvVar9;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
      pJVar5 = (JavascriptString *)addr->ptr;
    }
    goto LAB_00d08052;
  case 0x1a3:
    if (((pSVar1->config).threadConfig)->m_ES6RegExPrototypeProperties != false) {
      return false;
    }
    bVar3 = UnifiedRegex::RegexPattern::IsMultiline((this->pattern).ptr);
    break;
  case 0x1a4:
    if (((pSVar1->config).threadConfig)->m_ES6RegExPrototypeProperties != false) {
      return false;
    }
    bVar3 = UnifiedRegex::RegexPattern::IsDotAll((this->pattern).ptr);
    break;
  case 0x1a5:
    if (((pSVar1->config).threadConfig)->m_ES6RegExPrototypeProperties != false) {
      return false;
    }
    bVar3 = UnifiedRegex::RegexPattern::IsIgnoreCase((this->pattern).ptr);
    break;
  case 0x1a6:
    if (((pSVar1->config).threadConfig)->m_ES6RegExPrototypeProperties != false) {
      return false;
    }
    bVar3 = UnifiedRegex::RegexPattern::IsUnicode((this->pattern).ptr);
    break;
  case 0x1a7:
    if (((pSVar1->config).threadConfig)->m_ES6RegExPrototypeProperties != false) {
      return false;
    }
    bVar3 = UnifiedRegex::RegexPattern::IsSticky((this->pattern).ptr);
    break;
  default:
    if (propertyId == 0x153) {
      if (((pSVar1->config).threadConfig)->m_ES6RegExPrototypeProperties != false) {
        return false;
      }
      pJVar5 = ToString(this,true);
    }
    else {
      if (propertyId != 0x1e0) {
        return false;
      }
      if (((pSVar1->config).threadConfig)->m_ES6RegExPrototypeProperties != false) {
        return false;
      }
      pJVar5 = (JavascriptString *)GetOptions(this);
    }
    goto LAB_00d08052;
  }
  pJVar5 = (JavascriptString *)JavascriptLibrary::CreateBoolean(this_00,(uint)bVar3);
LAB_00d08052:
  *value = pJVar5;
  *result = 1;
  bVar3 = true;
switchD_00d07ece_caseD_1a1:
  return bVar3;
}

Assistant:

bool JavascriptRegExp::GetPropertyBuiltIns(PropertyId propertyId, Var* value, BOOL* result)
    {
        const ScriptConfiguration* scriptConfig = this->GetScriptContext()->GetConfig();

#define GET_FLAG(patternMethod) \
        if (!scriptConfig->IsES6RegExPrototypePropertiesEnabled()) \
        { \
            *value = this->GetLibrary()->CreateBoolean(this->GetPattern()->##patternMethod##()); \
            *result = true; \
            return true; \
        } \
        else \
        { \
            return false; \
        }

        switch (propertyId)
        {
        case PropertyIds::lastIndex:
            if (this->lastIndexVar == nullptr)
            {
                Assert(lastIndexOrFlag <= MaxCharCount);
                this->lastIndexVar = JavascriptNumber::ToVar(lastIndexOrFlag, GetScriptContext());
            }
            *value = this->lastIndexVar;
            *result = true;
            return true;
        case PropertyIds::global:
            GET_FLAG(IsGlobal)
        case PropertyIds::multiline:
            GET_FLAG(IsMultiline)
        case PropertyIds::dotAll:
            GET_FLAG(IsDotAll)
        case PropertyIds::ignoreCase:
            GET_FLAG(IsIgnoreCase)
        case PropertyIds::unicode:
            GET_FLAG(IsUnicode)
        case PropertyIds::sticky:
            GET_FLAG(IsSticky)
        case PropertyIds::source:
            if (!scriptConfig->IsES6RegExPrototypePropertiesEnabled())
            {
                *value = this->ToString(true);
                *result = true;
                return true;
            }
            else
            {
                return false;
            }
        case PropertyIds::options:
            if (!scriptConfig->IsES6RegExPrototypePropertiesEnabled())
            {
                *value = GetOptions();
                *result = true;
                return true;
            }
            else
            {
                return false;
            }
        default:
            return false;
        }

#undef GET_FLAG
    }